

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vhost.c
# Opt level: O3

int lws_vhost_foreach_listen_wsi(lws_context *cx,void *arg,lws_dll2_foreach_cb_t cb)

{
  lws_vhost *plVar1;
  int iVar2;
  
  plVar1 = cx->vhost_list;
  while ((iVar2 = 0, plVar1 != (lws_vhost *)0x0 &&
         (iVar2 = lws_dll2_foreach_safe(&plVar1->listen_wsi,arg,cb), iVar2 == 0))) {
    plVar1 = plVar1->vhost_next;
  }
  return iVar2;
}

Assistant:

int
lws_vhost_foreach_listen_wsi(struct lws_context *cx, void *arg,
			     lws_dll2_foreach_cb_t cb)
{
	struct lws_vhost *v = cx->vhost_list;
	int n;

	while (v) {

		n = lws_dll2_foreach_safe(&v->listen_wsi, arg, cb);
		if (n)
			return n;

		v = v->vhost_next;
	}

	return 0;
}